

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::GoogleTestFailureReporter::~GoogleTestFailureReporter
          (GoogleTestFailureReporter *this)

{
  void *in_RDI;
  
  ~GoogleTestFailureReporter((GoogleTestFailureReporter *)0x1935a8);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual void ReportFailure(FailureType type, const char* file, int line,
                             const string& message) {
    AssertHelper(type == kFatal ?
                 TestPartResult::kFatalFailure :
                 TestPartResult::kNonFatalFailure,
                 file,
                 line,
                 message.c_str()) = Message();
    if (type == kFatal) {
      posix::Abort();
    }
  }